

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O0

void blowfish_initkey(BlowfishContext *ctx)

{
  int local_14;
  int i;
  BlowfishContext *ctx_local;
  
  for (local_14 = 0; local_14 < 0x12; local_14 = local_14 + 1) {
    ctx->P[local_14] = parray[local_14];
  }
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    ctx->S0[local_14] = sbox0[local_14];
    ctx->S1[local_14] = sbox1[local_14];
    ctx->S2[local_14] = sbox2[local_14];
    ctx->S3[local_14] = sbox3[local_14];
  }
  return;
}

Assistant:

void blowfish_initkey(BlowfishContext *ctx)
{
    int i;

    for (i = 0; i < 18; i++) {
        ctx->P[i] = parray[i];
    }

    for (i = 0; i < 256; i++) {
        ctx->S0[i] = sbox0[i];
        ctx->S1[i] = sbox1[i];
        ctx->S2[i] = sbox2[i];
        ctx->S3[i] = sbox3[i];
    }
}